

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::StringReplace
              (JavascriptString *match,JavascriptString *input,JavascriptString *replace)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  charcount_t cVar6;
  char *pcVar7;
  char16 *content;
  char16 *prefix;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  CharCount CVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  CharCount CVar16;
  undefined1 local_280 [8];
  Builder<256U> concatenated;
  
  pcVar7 = JavascriptString::strstr((char *)input,(char *)match);
  CVar10 = (CharCount)pcVar7;
  if (CVar10 == 0xffffffff) {
    return input;
  }
  uVar13 = (ulong)pcVar7 & 0xffffffff;
  content = JavascriptString::GetString(replace);
  cVar4 = JavascriptString::GetLength(replace);
  if (cVar4 == 0) {
LAB_00d3e3da:
    prefix = JavascriptString::GetString(input);
    cVar4 = JavascriptString::GetLength(match);
    cVar5 = JavascriptString::GetLength(input);
    cVar6 = JavascriptString::GetLength(match);
    cVar5 = cVar5 - (cVar6 + CVar10);
    cVar6 = JavascriptString::GetLength(replace);
    local_280 = (undefined1  [8])
                BufferStringBuilder::WritableString::New
                          (CVar10 + cVar6 + cVar5,
                           (((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr);
    cVar6 = JavascriptString::GetLength(replace);
    BufferStringBuilder::DbgAssertNotFrozen((BufferStringBuilder *)local_280);
    BufferStringBuilder::WritableString::SetContent
              ((WritableString *)local_280,prefix,CVar10,content,cVar6,prefix + uVar13 + cVar4,cVar5
              );
    pJVar9 = BufferStringBuilder::ToString((BufferStringBuilder *)local_280);
  }
  else {
    cVar4 = JavascriptString::GetLength(replace);
    if (cVar4 < 9) {
      cVar4 = JavascriptString::GetLength(replace);
      uVar11 = 0;
      if (cVar4 != 0) {
        do {
          if (content[uVar11] == L'$') break;
          uVar11 = uVar11 + 1;
          cVar4 = JavascriptString::GetLength(replace);
        } while (uVar11 < cVar4);
      }
      cVar4 = JavascriptString::GetLength(replace);
      if (cVar4 <= (uint)uVar11) goto LAB_00d3e3da;
    }
    CompoundString::Builder<256U>::Builder
              ((Builder<256U> *)local_280,
               (((((input->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    if (concatenated._520_8_ == 0) {
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                (input,0,CVar10,(Builder<256U> *)local_280,false);
    }
    else {
      CompoundString::Append((CompoundString *)concatenated._520_8_,input,0,CVar10);
    }
    cVar4 = JavascriptString::GetLength(replace);
    if (cVar4 == 0) {
      uVar15 = 0;
      CVar16 = 0;
    }
    else {
      uVar11 = 0;
      CVar16 = 0;
      concatenated._548_4_ = CVar10;
      do {
        uVar14 = (uint)uVar11;
        uVar15 = uVar14;
        if (content[uVar11] == L'$') {
          uVar12 = uVar14 + 1;
          cVar4 = JavascriptString::GetLength(replace);
          if (uVar12 < cVar4) {
            cVar1 = content[uVar12];
            uVar15 = uVar12;
            if ((ushort)cVar1 < 0x27) {
              if (cVar1 == L'$') {
                CVar10 = uVar12 - CVar16;
                pJVar9 = replace;
                if (concatenated._520_8_ == 0) {
LAB_00d3e614:
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (pJVar9,CVar16,CVar10,(Builder<256U> *)local_280,false);
                }
                else {
LAB_00d3e5e7:
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,pJVar9,CVar16,CVar10);
                }
              }
              else {
                if (cVar1 != L'&') goto LAB_00d3e51f;
                if (concatenated._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (replace,CVar16,uVar14 - CVar16,(Builder<256U> *)local_280,false);
                }
                else {
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,replace,CVar16,uVar14 - CVar16);
                }
                if (concatenated._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (match,(Builder<256U> *)local_280,false);
                }
                else {
                  CompoundString::Append((CompoundString *)concatenated._520_8_,match);
                }
              }
              CVar16 = uVar14 + 2;
            }
            else {
              CVar10 = (CharCount)uVar13;
              if (cVar1 == L'\'') {
                if (concatenated._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (replace,CVar16,uVar14 - CVar16,(Builder<256U> *)local_280,false);
                }
                else {
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,replace,CVar16,uVar14 - CVar16);
                }
                cVar4 = JavascriptString::GetLength(match);
                cVar5 = JavascriptString::GetLength(input);
                cVar6 = JavascriptString::GetLength(match);
                CVar16 = cVar5 - (cVar6 + CVar10);
                if (concatenated._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (input,cVar4 + CVar10,CVar16,(Builder<256U> *)local_280,false);
                }
                else {
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,input,cVar4 + CVar10,CVar16);
                }
                CVar16 = uVar14 + 2;
                uVar13 = (ulong)(uint)concatenated._548_4_;
              }
              else if (cVar1 == L'`') {
                if (concatenated._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (replace,CVar16,uVar14 - CVar16,(Builder<256U> *)local_280,false);
                }
                else {
                  CompoundString::Append
                            ((CompoundString *)concatenated._520_8_,replace,CVar16,uVar14 - CVar16);
                }
                if (concatenated._520_8_ == 0) {
                  CVar16 = 0;
                  pJVar9 = input;
                  goto LAB_00d3e614;
                }
                CVar16 = 0;
                pJVar9 = input;
                goto LAB_00d3e5e7;
              }
            }
          }
        }
LAB_00d3e51f:
        uVar15 = uVar15 + 1;
        uVar11 = (ulong)uVar15;
        cVar4 = JavascriptString::GetLength(replace);
      } while (uVar15 < cVar4);
      if (uVar15 < CVar16) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x5c5,"(i <= j)","i <= j");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      CVar10 = (CharCount)uVar13;
    }
    if (concatenated._520_8_ == 0) {
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                (replace,CVar16,uVar15 - CVar16,(Builder<256U> *)local_280,false);
    }
    else {
      CompoundString::Append((CompoundString *)concatenated._520_8_,replace,CVar16,uVar15 - CVar16);
    }
    cVar4 = JavascriptString::GetLength(match);
    cVar5 = JavascriptString::GetLength(input);
    cVar6 = JavascriptString::GetLength(match);
    CVar16 = cVar5 - (cVar6 + CVar10);
    if (concatenated._520_8_ == 0) {
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                (input,cVar4 + CVar10,CVar16,(Builder<256U> *)local_280,false);
    }
    else {
      CompoundString::Append((CompoundString *)concatenated._520_8_,input,cVar4 + CVar10,CVar16);
    }
    pJVar9 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_280);
  }
  return pJVar9;
}

Assistant:

Var RegexHelper::StringReplace(JavascriptString* match, JavascriptString* input, JavascriptString* replace)
    {
        CharCount matchedIndex = JavascriptString::strstr(input, match, true);
        if (matchedIndex == CharCountFlag)
        {
            return input;
        }

        const char16 *const replaceStr = replace->GetString();

        // Unfortunately, due to the possibility of there being $ escapes, we can't just wmemcpy the replace string. Check if we
        // have a small replace string that we can quickly scan for '$', to see if we can just wmemcpy.
        bool definitelyNoEscapes = replace->GetLength() == 0;
        if(!definitelyNoEscapes && replace->GetLength() <= 8)
        {
            CharCount i = 0;
            for(; i < replace->GetLength() && replaceStr[i] != _u('$'); ++i);
            definitelyNoEscapes = i >= replace->GetLength();
        }

        if(definitelyNoEscapes)
        {
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = (CharCount)matchedIndex;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                                    replaceStr, replace->GetLength(),
                                    postfixStr, postfixLength);
            return bufferString.ToString();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(input->GetScriptContext());

        // Copy portion of input string that precedes the matched substring
        concatenated.Append(input, 0, matchedIndex);

        // Copy the replace string with substitutions
        CharCount i = 0, j = 0;
        for(; j < replace->GetLength(); ++j)
        {
            if(replaceStr[j] == _u('$') && j + 1 < replace->GetLength())
            {
                switch(replaceStr[j + 1])
                {
                    case _u('$'): // literal '$'
                        ++j;
                        concatenated.Append(replace, i, j - i);
                        i = j + 1;
                        break;

                    case _u('&'): // matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(match);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('`'): // portion of input string that precedes the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(input, 0, matchedIndex);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('\''): // portion of input string that follows the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(
                            input,
                            matchedIndex + match->GetLength(),
                            input->GetLength() - matchedIndex - match->GetLength());
                        ++j;
                        i = j + 1;
                        break;

                    default: // take both the initial '$' and the following character literally
                        ++j;
                }
            }
        }
        Assert(i <= j);
        concatenated.Append(replace, i, j - i);

        // Copy portion of input string that follows the matched substring
        concatenated.Append(input, matchedIndex + match->GetLength(), input->GetLength() - matchedIndex - match->GetLength());

        return concatenated.ToString();
    }